

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowDecorations
               (ImGuiWindow *window,ImRect *title_bar_rect,bool title_bar_is_highlight,
               int resize_grip_count,ImU32 *resize_grip_col,float resize_grip_draw_size)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint in_ECX;
  byte in_DL;
  undefined8 *in_RSI;
  long in_RDI;
  ImVec2 *pIVar3;
  float in_XMM0_Da;
  float fVar4;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  int i_1;
  int i;
  ImRect menu_bar_rect;
  ImU32 title_bar_col_1;
  float alpha;
  bool override_alpha;
  ImU32 bg_col;
  ImU32 title_bar_col;
  float backup_border_size;
  float window_border_size;
  float window_rounding;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  ImRect *in_stack_fffffffffffffdc8;
  ImGuiWindow *in_stack_fffffffffffffdd0;
  ImU32 col;
  ImVec2 *in_stack_fffffffffffffdd8;
  ImDrawList *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf0;
  ImGuiAxis axis;
  undefined8 uVar5;
  undefined4 in_stack_fffffffffffffe10;
  int iVar6;
  ImDrawList *this;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  ImVec2 in_stack_fffffffffffffe58;
  ImVec2 in_stack_fffffffffffffe60;
  ImRect local_170;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 in_stack_fffffffffffffec0;
  uint local_12c;
  ImVec2 local_128;
  ImVec2 local_120;
  int local_118;
  ImVec2 local_114;
  int local_10c;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImRect local_c8;
  undefined1 local_b8 [16];
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImU32 local_98;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  float local_6c;
  undefined1 local_65;
  ImU32 local_64;
  ImVector<ImVec4> local_60;
  ImU32 local_4c;
  float local_48;
  float local_44;
  int local_40;
  uint local_3c;
  ImVec2 *local_38;
  ImGuiContext *local_30;
  float local_24;
  uint local_18;
  byte local_11;
  undefined8 *local_10;
  long local_8;
  
  pIVar1 = GImGui;
  axis = (ImGuiAxis)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  fVar4 = (float)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_11 = in_DL & 1;
  local_30 = GImGui;
  local_38 = (ImVec2 *)&GImGui->Style;
  local_3c = *(uint *)(in_RDI + 0xc);
  *(undefined1 *)(in_RDI + 0x93) = 0;
  local_40 = *(int *)(in_RDI + 0x48);
  local_44 = *(float *)(in_RDI + 0x4c);
  if ((*(byte *)(in_RDI + 0x91) & 1) == 0) {
    local_24 = in_XMM0_Da;
    local_18 = in_ECX;
    local_8 = in_RDI;
    if ((local_3c & 0x80) == 0) {
      GetWindowBgColorIdxFromFlags(local_3c);
      local_64 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                             SUB84(in_stack_fffffffffffffdd0,0));
      local_6c = 1.0;
      local_65 = ((local_30->NextWindowData).Flags & 0x40U) != 0;
      if ((bool)local_65) {
        local_6c = (local_30->NextWindowData).BgAlphaVal;
        uVar2 = local_64 & 0xffffff;
        fVar4 = ImSaturate(local_6c);
        local_64 = uVar2 | (int)(fVar4 * 255.0 + 0.5) << 0x18;
      }
      fVar4 = ImGuiWindow::TitleBarHeight(in_stack_fffffffffffffdd0);
      ImVec2::ImVec2(&local_7c,0.0,fVar4);
      local_74 = operator+(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160d16);
      local_8c = operator+(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160d37);
      ImVec2::ImVec2(&local_94,1.0,1.0);
      local_84 = operator-(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160d75);
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (ImVec2 *)in_stack_fffffffffffffdd0,
                 (ImU32)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 SUB84(in_stack_fffffffffffffdc8,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    }
    if ((local_3c & 1) == 0) {
      local_98 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                             SUB84(in_stack_fffffffffffffdd0,0));
      ImVec2::ImVec2(&local_a8,1.0,1.0);
      local_a0 = operator-(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160e6e);
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (ImVec2 *)in_stack_fffffffffffffdd0,
                 (ImU32)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 SUB84(in_stack_fffffffffffffdc8,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    }
    if ((local_3c & 0x400) != 0) {
      local_b8 = (undefined1  [16])ImGuiWindow::MenuBarRect(in_stack_fffffffffffffdd0);
      local_c8 = ImGuiWindow::Rect((ImGuiWindow *)0x160ef8);
      this = (ImDrawList *)local_b8;
      ImRect::ClipWith((ImRect *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      pIVar3 = *(ImVec2 **)(local_8 + 0x2b8);
      ImVec2::ImVec2(&local_d8,local_44,0.0);
      local_d0 = operator+(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160f65);
      ImVec2::ImVec2(&local_e8,local_44 + 1.0,1.0);
      local_e0 = operator-(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x160faa);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                  SUB84(in_stack_fffffffffffffdd0,0));
      iVar6 = local_40;
      if ((local_3c & 1) == 0) {
        iVar6 = 0;
      }
      ImDrawList::AddRectFilled
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (ImVec2 *)in_stack_fffffffffffffdd0,
                 (ImU32)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 SUB84(in_stack_fffffffffffffdc8,0),
                 (ImDrawCornerFlags)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      if ((0.0 < local_38[8].y) &&
         ((float)local_b8._12_4_ < *(float *)(local_8 + 0x14) + *(float *)(local_8 + 0x1c))) {
        uVar5 = *(undefined8 *)(local_8 + 0x2b8);
        local_f0 = ImRect::GetBL(in_stack_fffffffffffffdb8);
        local_f8 = ImRect::GetBR((ImRect *)local_b8);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                    SUB84(in_stack_fffffffffffffdd0,0));
        ImDrawList::AddLine(this,pIVar3,(ImVec2 *)CONCAT44(iVar6,in_stack_fffffffffffffe10),
                            (ImU32)((ulong)uVar5 >> 0x20),(float)uVar5);
      }
    }
    if ((*(byte *)(local_8 + 0x8c) & 1) != 0) {
      Scrollbar(axis);
    }
    if ((*(byte *)(local_8 + 0x8d) & 1) != 0) {
      Scrollbar(axis);
    }
    if (((uint)local_38[0x17].x & 0x1000000) != 0) {
      ImVec2::ImVec2(&local_100,*(float *)(local_8 + 0x10) - 1.0,
                     (*(float *)(local_8 + 0x14) + *(float *)(local_8 + 0x1c)) - 1.0);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                  SUB84(in_stack_fffffffffffffdd0,0));
      ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (ImU32)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                          (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ImVec2::ImVec2(&local_108,(*(float *)(local_8 + 0x10) + *(float *)(local_8 + 0x18)) - 2.0,
                     (*(float *)(local_8 + 0x14) + *(float *)(local_8 + 0x1c)) - 1.0);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                  SUB84(in_stack_fffffffffffffdd0,0));
      ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (ImU32)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                          (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      for (local_10c = 0; (float)local_10c < *(float *)(local_8 + 0x18) - 2.0;
          local_10c = local_10c + 1) {
        ImVec2::ImVec2(&local_114,*(float *)(local_8 + 0x10) + (float)local_10c,
                       (*(float *)(local_8 + 0x14) + *(float *)(local_8 + 0x1c)) - 1.0);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                    SUB84(in_stack_fffffffffffffdd0,0));
        ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (ImU32)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                            (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      }
      for (local_118 = 1; (float)local_118 < *(float *)(local_8 + 0x1c) - 1.0;
          local_118 = local_118 + 1) {
        in_stack_fffffffffffffdd8 = *(ImVec2 **)(local_8 + 0x2b8);
        ImVec2::ImVec2(&local_120,*(float *)(local_8 + 0x10) - 1.0,
                       *(float *)(local_8 + 0x14) + (float)local_118);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                    SUB84(in_stack_fffffffffffffdd0,0));
        ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (ImU32)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                            (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffde0 = *(ImDrawList **)(local_8 + 0x2b8);
        ImVec2::ImVec2(&local_128,(*(float *)(local_8 + 0x10) + *(float *)(local_8 + 0x18)) - 2.0,
                       *(float *)(local_8 + 0x14) + (float)local_118);
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                    SUB84(in_stack_fffffffffffffdd0,0));
        ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            (ImU32)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                            (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      }
    }
    if ((local_3c & 2) == 0) {
      for (local_12c = 0; (int)local_12c < (int)local_18; local_12c = local_12c + 1) {
        pIVar3 = (ImVec2 *)(local_8 + 0x10);
        local_148 = operator+(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x161511);
        in_stack_fffffffffffffec0 =
             ImLerp(&in_stack_fffffffffffffdc8->Min,pIVar3,&in_stack_fffffffffffffdb8->Min);
        in_stack_fffffffffffffdc8 = *(ImRect **)(local_8 + 0x2b8);
        col = (ImU32)((ulong)((long)(int)local_12c * 0x18 + 0x287128) >> 0x20);
        if ((local_12c & 1) == 0) {
          ImVec2::ImVec2(&local_170.Max,local_24,local_44);
        }
        else {
          ImVec2::ImVec2(&local_170.Max,local_44,local_24);
        }
        local_160 = operator*(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x1615c3);
        local_158 = operator+(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x1615e1);
        in_stack_fffffffffffffdb8 = &local_170;
        ImVec2::ImVec2(&in_stack_fffffffffffffdb8->Min,1.0,1.0);
        local_150 = operator-(&in_stack_fffffffffffffdb8->Min,(ImVec2 *)0x161617);
        ImDrawList::AddText(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,col,
                            (char *)in_stack_fffffffffffffdc8,(char *)pIVar3);
      }
    }
    RenderWindowOuterBorders((ImGuiWindow *)in_stack_fffffffffffffec0);
  }
  else {
    local_48 = (pIVar1->Style).FrameBorderSize;
    (pIVar1->Style).FrameBorderSize = *(float *)(in_RDI + 0x4c);
    local_10 = in_RSI;
    local_4c = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                           SUB84(in_stack_fffffffffffffdd0,0));
    local_60.Data = (ImVec4 *)*local_10;
    local_60._0_8_ = local_10[1];
    RenderFrame(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                (ImU32)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                SUB81((ulong)in_stack_fffffffffffffe50 >> 0x18,0),fVar4);
    (local_30->Style).FrameBorderSize = local_48;
  }
  return;
}

Assistant:

void ImGui::RenderWindowDecorations(ImGuiWindow* window, const ImRect& title_bar_rect, bool title_bar_is_highlight, int resize_grip_count, const ImU32 resize_grip_col[4], float resize_grip_draw_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    // Ensure that ScrollBar doesn't read last frame's SkipItems
    IM_ASSERT(window->BeginCount == 0);
    window->SkipItems = false;

    // Draw window + handle manual resize
    // As we highlight the title bar when want_focus is set, multiple reappearing windows will have have their title bar highlighted on their reappearing frame.
    const float window_rounding = window->WindowRounding;
    const float window_border_size = window->WindowBorderSize;
    if (window->Collapsed)
    {
        // Title bar only
        float backup_border_size = style.FrameBorderSize;
        g.Style.FrameBorderSize = window->WindowBorderSize;
        ImU32 title_bar_col = GetColorU32((title_bar_is_highlight && !g.NavDisableHighlight) ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBgCollapsed);
        RenderFrame(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, true, window_rounding);
        g.Style.FrameBorderSize = backup_border_size;
    }
    else
    {
        // Window background
        if (!(flags & ImGuiWindowFlags_NoBackground))
        {
            ImU32 bg_col = GetColorU32(GetWindowBgColorIdxFromFlags(flags));
            bool override_alpha = false;
            float alpha = 1.0f;
            if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasBgAlpha)
            {
                alpha = g.NextWindowData.BgAlphaVal;
                override_alpha = true;
            }
            if (override_alpha)
                bg_col = (bg_col & ~IM_COL32_A_MASK) | (IM_F32_TO_INT8_SAT(alpha) << IM_COL32_A_SHIFT);
            window->DrawList->AddRectFilled(window->Pos + ImVec2(0, window->TitleBarHeight()), window->Pos + window->Size - ImVec2(1, 1), bg_col, window_rounding, (flags & ImGuiWindowFlags_NoTitleBar) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Bot);
        }

        // Title bar
        if (!(flags & ImGuiWindowFlags_NoTitleBar))
        {
            ImU32 title_bar_col = GetColorU32(title_bar_is_highlight ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg);
            window->DrawList->AddRectFilled(title_bar_rect.Min, title_bar_rect.Max - ImVec2(1, 1), title_bar_col, window_rounding, ImDrawCornerFlags_Top);
        }

        // Menu bar
        if (flags & ImGuiWindowFlags_MenuBar)
        {
            ImRect menu_bar_rect = window->MenuBarRect();
            menu_bar_rect.ClipWith(window->Rect());  // Soft clipping, in particular child window don't have minimum size covering the menu bar so this is useful for them.
            window->DrawList->AddRectFilled(menu_bar_rect.Min + ImVec2(window_border_size, 0), menu_bar_rect.Max - ImVec2(window_border_size + 1, 1), GetColorU32(ImGuiCol_MenuBarBg), (flags & ImGuiWindowFlags_NoTitleBar) ? window_rounding : 0.0f, ImDrawCornerFlags_Top);
            if (style.FrameBorderSize > 0.0f && menu_bar_rect.Max.y < window->Pos.y + window->Size.y)
                window->DrawList->AddLine(menu_bar_rect.GetBL(), menu_bar_rect.GetBR(), GetColorU32(ImGuiCol_Border), style.FrameBorderSize);
        }

        // Scrollbars
        if (window->ScrollbarX)
            Scrollbar(ImGuiAxis_X);
        if (window->ScrollbarY)
            Scrollbar(ImGuiAxis_Y);

        // Ascii borders
        if (style.WindowBorderAscii) {
            window->DrawList->AddText(ImVec2(window->Pos.x - 1, window->Pos.y + window->Size.y - 1), GetColorU32(ImGuiCol_Border), "\\");
            window->DrawList->AddText(ImVec2(window->Pos.x + window->Size.x - 2, window->Pos.y + window->Size.y - 1), GetColorU32(ImGuiCol_Border), "/");
            for (int i = 0; i < window->Size.x - 2; ++i) {
                window->DrawList->AddText(ImVec2(window->Pos.x + i, window->Pos.y + window->Size.y - 1), GetColorU32(ImGuiCol_Border), "-");
            }
            for (int i = 1; i < window->Size.y - 1; ++i) {
                window->DrawList->AddText(ImVec2(window->Pos.x - 1, window->Pos.y + i), GetColorU32(ImGuiCol_Border), "|");
                window->DrawList->AddText(ImVec2(window->Pos.x + window->Size.x - 2, window->Pos.y + i), GetColorU32(ImGuiCol_Border), "|");
            }
        }

        // Render resize grips (after their input handling so we don't have a frame of latency)
        if (!(flags & ImGuiWindowFlags_NoResize))
        {
            for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
            {
                const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
                const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);
                //window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(window_border_size, resize_grip_draw_size) : ImVec2(resize_grip_draw_size, window_border_size)));
                //window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(resize_grip_draw_size, window_border_size) : ImVec2(window_border_size, resize_grip_draw_size)));
                //window->DrawList->PathArcToFast(ImVec2(corner.x + grip.InnerDir.x * (window_rounding + window_border_size), corner.y + grip.InnerDir.y * (window_rounding + window_border_size)), window_rounding, grip.AngleMin12, grip.AngleMax12);
                //window->DrawList->PathFillConvex(resize_grip_col[resize_grip_n]);
                window->DrawList->AddText(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(window_border_size, resize_grip_draw_size) : ImVec2(resize_grip_draw_size, window_border_size)) - ImVec2(1, 1), resize_grip_col[resize_grip_n], "+");
            }
        }

        // Borders
        RenderWindowOuterBorders(window);
    }
}